

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O1

void __thiscall ExactFloat::ExactFloat(ExactFloat *this,int v)

{
  int iVar1;
  BIGNUM *a;
  ulong w;
  S2LogMessage SStack_28;
  
  a = BN_new();
  (this->bn_).bn_ = (BIGNUM *)a;
  this->sign_ = v >> 0x1f | 1;
  w = (ulong)(uint)-v;
  if (0 < v) {
    w = (ulong)(uint)v;
  }
  iVar1 = BN_set_word(a,w);
  if (iVar1 != 0) {
    this->bn_exp_ = 0;
    Canonicalize(this);
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
             ,0xb9,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_28.stream_,"Check failed: BN_set_word(bn_.get(), abs(v)) ",0x2d);
  abort();
}

Assistant:

ExactFloat::ExactFloat(int v) {
  sign_ = (v >= 0) ? 1 : -1;
  // Note that this works even for INT_MIN because the parameter type for
  // BN_set_word() is unsigned.
  S2_CHECK(BN_set_word(bn_.get(), abs(v)));
  bn_exp_ = 0;
  Canonicalize();
}